

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-ls.c
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  char *in_RAX;
  char *pcVar3;
  char *pcVar4;
  BigFile local_28;
  BigFile bf;
  
  pcVar4 = "l";
  local_28.basename = in_RAX;
  while (iVar2 = getopt(argc,argv,"l"), iVar2 == 0x6c) {
    longfmt = 1;
  }
  if ((iVar2 == -1) && (pcVar4 = (char *)(long)_optind, _optind < argc)) {
    if (argc - _optind == 1) {
      listbigfile(argv[(long)pcVar4]);
      return 0;
    }
    local_28.basename = (char *)0x0;
    iVar2 = big_file_open(&local_28,argv[(long)pcVar4]);
    if (iVar2 == 0) {
      iVar2 = listbigblock(&local_28,argv[(long)(pcVar4 + 1)]);
      pFVar1 = _stderr;
      if (iVar2 != 0) {
        pcVar4 = big_file_get_error_message();
        fprintf(pFVar1,"failed to open: %s\n",pcVar4);
      }
      big_file_close(&local_28);
      return 0;
    }
  }
  else {
    usage();
  }
  pFVar1 = _stderr;
  pcVar4 = argv[(long)pcVar4];
  pcVar3 = big_file_get_error_message();
  fprintf(pFVar1,"failed to open: %s : %s\n",pcVar4,pcVar3);
  exit(1);
}

Assistant:

int main(int argc, char * argv[]) {
    int opt;
    while(-1 != (opt = getopt(argc, argv, "l"))) {
        switch(opt){
            case 'l':
                longfmt = 1;
                break;
            default:
                usage();
        }
    }
    if(argc - optind < 1) {
        usage();
    }
    argv += optind - 1;
    if(argc - optind == 1) {
        listbigfile(argv[1]);
    } else {
        BigFile bf = {0};
        if(0 != big_file_open(&bf, argv[1])) {
            fprintf(stderr, "failed to open: %s : %s\n", argv[1], big_file_get_error_message());
            exit(1);
        }
        if(0 != listbigblock(&bf, argv[2])) {
            fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        }
        big_file_close(&bf);
    }
    return 0;
}